

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worm.c
# Opt level: O0

void remove_worm(monst *worm)

{
  wseg *local_18;
  wseg *curr;
  monst *worm_local;
  
  local_18 = level->wtails[worm->wormno];
  if (worm->wormno == '\0') {
    warning("remove_worm: worm->wormno was 0");
  }
  else {
    for (; local_18 != (wseg *)0x0; local_18 = local_18->nseg) {
      remove_monster(level,(int)local_18->wx,(int)local_18->wy);
      newsym((int)local_18->wx,(int)local_18->wy);
    }
  }
  return;
}

Assistant:

void remove_worm(struct monst *worm)
{
    struct wseg *curr = level->wtails[worm->wormno];

    if (!worm->wormno) {
	warning("remove_worm: worm->wormno was 0");
	return;
    }

    while (curr) {
	remove_monster(level, curr->wx, curr->wy);
	newsym(curr->wx, curr->wy);
	curr = curr->nseg;
    }
}